

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*in_RCX) [16];
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  __m128i *extraout_XMM0_Qa_00;
  __m128i *top1;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i *top0;
  __m128i *extraout_XMM0_Qb_01;
  __m128i r32h_1;
  __m128i r32l_1;
  __m128i r32h;
  __m128i r32l;
  int i;
  __m128i l16;
  __m128i l;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i zero;
  __m128i b;
  __m128i a;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  __m128i *in_stack_fffffffffffffca0;
  __m128i *in_stack_fffffffffffffca8;
  int local_32c;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_250;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  
  local_2f8 = 0x8000800080008000;
  uStack_2f0 = 0x8000800080008000;
  auVar3 = *in_RCX;
  local_250 = in_RDI;
  for (local_32c = 0; local_32c < 0x10; local_32c = local_32c + 1) {
    auVar2._8_8_ = uStack_2f0;
    auVar2._0_8_ = local_2f8;
    pshufb(auVar3,auVar2);
    paeth_16x1_pred(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffc90);
    paeth_16x1_pred(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffc90);
    *local_250 = extraout_XMM0_Qa;
    local_250[1] = extraout_XMM0_Qb;
    local_250[2] = extraout_XMM0_Qa_00;
    local_250[3] = extraout_XMM0_Qb_00;
    local_250 = (undefined8 *)(in_RSI + (long)local_250);
    local_178 = (short)local_2f8;
    sStack_176 = (short)((ulong)local_2f8 >> 0x10);
    sStack_174 = (short)((ulong)local_2f8 >> 0x20);
    sStack_172 = (short)((ulong)local_2f8 >> 0x30);
    sStack_170 = (short)uStack_2f0;
    sStack_16e = (short)((ulong)uStack_2f0 >> 0x10);
    sStack_16c = (short)((ulong)uStack_2f0 >> 0x20);
    sStack_16a = (short)((ulong)uStack_2f0 >> 0x30);
    local_2f8._0_4_ = CONCAT22(sStack_176 + 1,local_178 + 1);
    local_2f8._0_6_ = CONCAT24(sStack_174 + 1,(undefined4)local_2f8);
    local_2f8 = CONCAT26(sStack_172 + 1,(undefined6)local_2f8);
    uStack_2f0._0_4_ = CONCAT22(sStack_16e + 1,sStack_170 + 1);
    uStack_2f0._0_6_ = CONCAT24(sStack_16c + 1,(undefined4)uStack_2f0);
    uStack_2f0 = CONCAT26(sStack_16a + 1,(undefined6)uStack_2f0);
    in_stack_fffffffffffffca8 = extraout_XMM0_Qa_00;
  }
  local_2f8 = 0x8000800080008000;
  uStack_2f0 = 0x8000800080008000;
  auVar3 = in_RCX[1];
  for (local_32c = 0; local_32c < 0x10; local_32c = local_32c + 1) {
    auVar1._8_8_ = uStack_2f0;
    auVar1._0_8_ = local_2f8;
    pshufb(auVar3,auVar1);
    paeth_16x1_pred(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffc90);
    in_stack_fffffffffffffc98 = top1;
    in_stack_fffffffffffffca0 = top0;
    paeth_16x1_pred(in_stack_fffffffffffffca8,top0,top1,in_stack_fffffffffffffc90);
    *local_250 = in_stack_fffffffffffffc98;
    local_250[1] = in_stack_fffffffffffffca0;
    local_250[2] = extraout_XMM0_Qa_01;
    local_250[3] = extraout_XMM0_Qb_01;
    local_250 = (undefined8 *)(in_RSI + (long)local_250);
    local_198 = (short)local_2f8;
    sStack_196 = (short)((ulong)local_2f8 >> 0x10);
    sStack_194 = (short)((ulong)local_2f8 >> 0x20);
    sStack_192 = (short)((ulong)local_2f8 >> 0x30);
    sStack_190 = (short)uStack_2f0;
    sStack_18e = (short)((ulong)uStack_2f0 >> 0x10);
    sStack_18c = (short)((ulong)uStack_2f0 >> 0x20);
    sStack_18a = (short)((ulong)uStack_2f0 >> 0x30);
    local_2f8._0_4_ = CONCAT22(sStack_196 + 1,local_198 + 1);
    local_2f8._0_6_ = CONCAT24(sStack_194 + 1,(undefined4)local_2f8);
    local_2f8 = CONCAT26(sStack_192 + 1,(undefined6)local_2f8);
    uStack_2f0._0_4_ = CONCAT22(sStack_18e + 1,sStack_190 + 1);
    uStack_2f0._0_6_ = CONCAT24(sStack_18c + 1,(undefined4)uStack_2f0);
    uStack_2f0 = CONCAT26(sStack_18a + 1,(undefined6)uStack_2f0);
    in_stack_fffffffffffffc90 = extraout_XMM0_Qb_01;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  rep = _mm_set1_epi16((short)0x8000);
  l = _mm_load_si128((const __m128i *)(left + 16));
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}